

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::BufferViewTestInstance::~BufferViewTestInstance
          (BufferViewTestInstance *this)

{
  BufferViewTestInstance_conflict *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BufferViewTestInstance_0165d930;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&this[0xe].super_TestInstance.m_context);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &this[0xd].m_testCase.usage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&this[0xd].super_TestInstance.m_context);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)&this[0xc].m_testCase.offset);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&this[0xb].m_testCase.usage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&this[0xb].super_TestInstance.m_context);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&this[10].m_testCase.offset);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &this[10].super_TestInstance.m_context);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &this[9].m_testCase.range);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)(this + 9));
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&this[8].m_testCase);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&this[7].m_testCase.range);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)12>_> *)(this + 7));
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &this[6].m_testCase.range);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)(this + 6));
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&this[5].m_testCase);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&this[4].m_testCase.range);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)(this + 4));
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&this[3].m_testCase);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&this[2].m_testCase.range);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)(this + 2));
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &this[1].m_testCase.range);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)(this + 1));
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

BufferViewTestInstance::~BufferViewTestInstance	(void)
{
}